

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

size_t __thiscall
kws::Parser::FindClosingChar
          (Parser *this,char openChar,char closeChar,size_t pos,bool noComment,string *buffer)

{
  bool bVar1;
  ulong uVar2;
  Parser *pPVar3;
  char *pcVar4;
  char *pcVar5;
  reference ppVar6;
  Parser *in_RCX;
  char in_DL;
  char in_SIL;
  byte in_R8B;
  string *in_R9;
  size_t j;
  const_iterator itLS;
  bool skip;
  size_t i;
  size_t open;
  string stream;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffff08;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff10;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  *in_stack_ffffffffffffff18;
  Parser *this_00;
  Parser *local_90;
  __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  local_80;
  byte local_71;
  Parser *local_70;
  long local_68;
  string local_50 [47];
  byte local_21;
  Parser *local_20;
  char local_12;
  char local_11;
  Parser *local_8;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_12 = in_DL;
  local_11 = in_SIL;
  std::__cxx11::string::string(local_50,in_R9);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::__cxx11::string::operator=(local_50,pcVar4);
    if ((local_21 & 1) != 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::operator=(local_50,pcVar4);
    }
  }
  local_68 = 1;
  do {
    local_70 = (Parser *)
               ((long)&(local_20->m_ErrorList).
                       super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1);
    this_00 = local_70;
    pPVar3 = (Parser *)std::__cxx11::string::length();
    if (pPVar3 <= this_00) {
      local_8 = (Parser *)0xffffffffffffffff;
      goto LAB_00137495;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
    if ((*pcVar4 == local_11) ||
       (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_50), *pcVar5 == local_12)) {
      local_71 = 0;
      local_80._M_current =
           (pair<unsigned_long,_unsigned_long> *)
           std::
           vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ::begin(in_stack_ffffffffffffff08);
      while( true ) {
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::end(in_stack_ffffffffffffff08);
        bVar1 = __gnu_cxx::operator!=
                          (in_stack_ffffffffffffff10,
                           (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                            *)in_stack_ffffffffffffff08);
        if (!bVar1) break;
        local_90 = local_70;
        if ((local_21 & 1) != 0) {
          local_90 = (Parser *)GetPositionWithoutComments(this_00,(size_t)pcVar4);
        }
        ppVar6 = __gnu_cxx::
                 __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                 ::operator*(&local_80);
        if (((Parser *)ppVar6->first < local_90) &&
           (ppVar6 = __gnu_cxx::
                     __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                     ::operator*(&local_80), local_90 < (Parser *)ppVar6->second)) {
          local_71 = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::operator++(in_stack_ffffffffffffff18,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      }
      if ((local_71 & 1) == 0) {
        in_stack_ffffffffffffff18 =
             (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
              *)std::__cxx11::string::operator[]((ulong)local_50);
        if (*(char *)&in_stack_ffffffffffffff18->_M_current == local_11) {
          local_68 = local_68 + 1;
        }
        else {
          in_stack_ffffffffffffff10 =
               (__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                *)std::__cxx11::string::operator[]((ulong)local_50);
          if (*(char *)&in_stack_ffffffffffffff10->_M_current == local_12) {
            local_68 = local_68 + -1;
          }
        }
      }
    }
    local_20 = local_70;
  } while (local_68 != 0);
  local_8 = local_70;
LAB_00137495:
  std::__cxx11::string::~string(local_50);
  return (size_t)local_8;
}

Assistant:

size_t Parser::FindClosingChar(char openChar, char closeChar,
                               size_t pos,bool noComment,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_Buffer.c_str();
    if(noComment)
      {
      stream = m_BufferNoComment.c_str();
      }
  }

  size_t open = 1;
  for(size_t i=pos+1;i<stream.length();i++)
    {
    if(stream[i] == openChar || stream[i] == closeChar)
      {
      bool skip = false;
      // We want to check that we are not in the #if/#else/#endif thing
      auto itLS = m_IfElseEndifList.begin();
      while(itLS != m_IfElseEndifList.end())
        {
        size_t j = i;
        if(noComment)
          {
          j = this->GetPositionWithoutComments(i);
          }
        if(j>(*itLS).first && j<(*itLS).second)
          {
          skip = true;
          break;
          }
        itLS++;
        }

      if(!skip)
        {
        if(stream[i] == openChar)
          {
          open++;
          }
        else if(stream[i] == closeChar)
          {
          open--;
          }
        }
      }
    if(open == 0)
      {
      return i;
      }
    }
  return std::string::npos; // closing char not found
}